

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::PushEvalStack(WasmBytecodeGenerator *this,PolymorphicEmitInfo info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 uVar4;
  uint32 i;
  uint32 index;
  undefined1 local_48 [8];
  PolymorphicEmitInfo info_local;
  
  info_local._0_8_ = info.field_1;
  uVar4 = info.count;
  local_48._0_4_ = uVar4;
  if ((this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x82f,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  for (index = 0; uVar4 != index; index = index + 1) {
    info_local.field_1.singleInfo =
         PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_48,index);
    JsUtil::
    List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (&(this->m_evalStack).list,&info_local.field_1.singleInfo);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::PushEvalStack(PolymorphicEmitInfo info)
{
    Assert(!m_evalStack.Empty());
    for (uint32 i = 0; i < info.Count(); ++i)
    {
        m_evalStack.Push(info.GetInfo(i));
    }
}